

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O2

void png_do_gray_to_rgb(png_row_infop row_info,png_bytep row)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  png_byte pVar5;
  ulong uVar6;
  
  bVar2 = row_info->bit_depth;
  if ((7 < bVar2) && (bVar1 = row_info->color_type, (bVar1 & 2) == 0)) {
    uVar4 = (ulong)row_info->width;
    if (bVar1 == 4) {
      uVar6 = uVar4;
      if (bVar2 == 8) {
        for (; (int)uVar6 != 0; uVar6 = uVar6 - 1) {
          row[uVar6 * 4 + -1] = row[uVar6 * 2 + -1];
          pVar5 = row[uVar6 * 2 + -2];
          row[uVar6 * 4 + -2] = pVar5;
          row[uVar6 * 4 + -3] = pVar5;
          row[uVar6 * 4 + -4] = row[uVar6 * 2 + -2];
        }
      }
      else {
        for (; (int)uVar6 != 0; uVar6 = uVar6 - 1) {
          row[uVar6 * 8 + -1] = row[uVar6 * 4 + -1];
          row[uVar6 * 8 + -2] = row[uVar6 * 4 + -2];
          row[uVar6 * 8 + -3] = row[uVar6 * 4 + -3];
          row[uVar6 * 8 + -4] = row[uVar6 * 4 + -4];
          row[uVar6 * 8 + -5] = row[uVar6 * 4 + -3];
          row[uVar6 * 8 + -6] = row[uVar6 * 4 + -4];
          row[uVar6 * 8 + -7] = row[uVar6 * 4 + -3];
          row[uVar6 * 8 + -8] = row[uVar6 * 4 + -4];
        }
      }
    }
    else if (bVar1 == 0) {
      if (bVar2 == 8) {
        lVar3 = uVar4 * 3;
        for (uVar6 = uVar4; (int)uVar6 != 0; uVar6 = uVar6 - 1) {
          pVar5 = row[uVar6 - 1];
          row[lVar3 + -1] = pVar5;
          row[lVar3 + -2] = pVar5;
          row[lVar3 + -3] = row[uVar6 - 1];
          lVar3 = lVar3 + -3;
        }
      }
      else {
        lVar3 = uVar4 * 3;
        for (uVar6 = uVar4; (int)uVar6 != 0; uVar6 = uVar6 - 1) {
          row[lVar3 * 2 + -1] = row[uVar6 * 2 + -1];
          row[lVar3 * 2 + -2] = row[uVar6 * 2 + -2];
          row[lVar3 * 2 + -3] = row[uVar6 * 2 + -1];
          row[lVar3 * 2 + -4] = row[uVar6 * 2 + -2];
          row[lVar3 * 2 + -5] = row[uVar6 * 2 + -1];
          row[lVar3 * 2 + -6] = row[uVar6 * 2 + -2];
          lVar3 = lVar3 + -3;
        }
      }
    }
    pVar5 = row_info->channels + '\x02';
    row_info->channels = pVar5;
    row_info->color_type = row_info->color_type | 2;
    bVar2 = row_info->bit_depth * pVar5;
    row_info->pixel_depth = bVar2;
    if (bVar2 < 8) {
      uVar4 = bVar2 * uVar4 + 7 >> 3;
    }
    else {
      uVar4 = (bVar2 >> 3) * uVar4;
    }
    row_info->rowbytes = uVar4;
  }
  return;
}

Assistant:

static void
png_do_gray_to_rgb(png_row_infop row_info, png_bytep row)
{
   png_uint_32 i;
   png_uint_32 row_width = row_info->width;

   png_debug(1, "in png_do_gray_to_rgb");

   if (row_info->bit_depth >= 8 &&
       (row_info->color_type & PNG_COLOR_MASK_COLOR) == 0)
   {
      if (row_info->color_type == PNG_COLOR_TYPE_GRAY)
      {
         if (row_info->bit_depth == 8)
         {
            /* This changes G to RGB */
            png_bytep sp = row + (size_t)row_width - 1;
            png_bytep dp = sp  + (size_t)row_width * 2;
            for (i = 0; i < row_width; i++)
            {
               *(dp--) = *sp;
               *(dp--) = *sp;
               *(dp--) = *(sp--);
            }
         }

         else
         {
            /* This changes GG to RRGGBB */
            png_bytep sp = row + (size_t)row_width * 2 - 1;
            png_bytep dp = sp  + (size_t)row_width * 4;
            for (i = 0; i < row_width; i++)
            {
               *(dp--) = *sp;
               *(dp--) = *(sp - 1);
               *(dp--) = *sp;
               *(dp--) = *(sp - 1);
               *(dp--) = *(sp--);
               *(dp--) = *(sp--);
            }
         }
      }

      else if (row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA)
      {
         if (row_info->bit_depth == 8)
         {
            /* This changes GA to RGBA */
            png_bytep sp = row + (size_t)row_width * 2 - 1;
            png_bytep dp = sp  + (size_t)row_width * 2;
            for (i = 0; i < row_width; i++)
            {
               *(dp--) = *(sp--);
               *(dp--) = *sp;
               *(dp--) = *sp;
               *(dp--) = *(sp--);
            }
         }

         else
         {
            /* This changes GGAA to RRGGBBAA */
            png_bytep sp = row + (size_t)row_width * 4 - 1;
            png_bytep dp = sp  + (size_t)row_width * 4;
            for (i = 0; i < row_width; i++)
            {
               *(dp--) = *(sp--);
               *(dp--) = *(sp--);
               *(dp--) = *sp;
               *(dp--) = *(sp - 1);
               *(dp--) = *sp;
               *(dp--) = *(sp - 1);
               *(dp--) = *(sp--);
               *(dp--) = *(sp--);
            }
         }
      }
      row_info->channels = (png_byte)(row_info->channels + 2);
      row_info->color_type |= PNG_COLOR_MASK_COLOR;
      row_info->pixel_depth = (png_byte)(row_info->channels *
          row_info->bit_depth);
      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth, row_width);
   }
}